

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O3

_undo_action * canvas_undo_init(_glist *x)

{
  int iVar1;
  _undo *p_Var2;
  _undo_action *p_Var3;
  _undo_action *p_Var4;
  
  p_Var2 = canvas_undo_get(x);
  if (p_Var2 == (_undo *)0x0) {
    p_Var3 = (_undo_action *)0x0;
  }
  else {
    p_Var3 = (_undo_action *)getbytes(0x30);
    p_Var3->type = UNDO_INIT;
    p_Var3->x = x;
    p_Var3->next = (_undo_action *)0x0;
    if (p_Var2->u_queue == (_undo_action *)0x0) {
      p_Var2->u_queue = p_Var3;
      p_Var2->u_last = p_Var3;
      canvas_undo_cleardirty(x);
      iVar1 = canvas_isabstraction(x);
      if (iVar1 == 0) {
        p_Var2->u_cleanstate = (void *)0x1;
      }
      p_Var3->prev = (_undo_action *)0x0;
      p_Var3->name = "no";
      canvas_show_undomenu(x,"no","no");
    }
    else {
      p_Var4 = p_Var2->u_last;
      if (p_Var4->next != (_undo_action *)0x0) {
        canvas_undo_rebranch(x);
        p_Var4 = p_Var2->u_last;
      }
      p_Var4->next = p_Var3;
      p_Var3->prev = p_Var4;
      p_Var2->u_last = p_Var3;
    }
  }
  return p_Var3;
}

Assistant:

t_undo_action *canvas_undo_init(t_canvas *x)
{
    t_undo_action *a = 0;
    t_undo *udo = canvas_undo_get(x);
    if (!udo) return 0;
    a = (t_undo_action *)getbytes(sizeof(*a));
    a->type = 0;
    a->x = x;
    a->next = NULL;

    if (!udo->u_queue)
    {
        DEBUG_UNDO(post("%s: first init", __FUNCTION__));
        //this is the first init
        udo->u_queue = a;
        udo->u_last = a;

        canvas_undo_cleardirty(x);
            /* invalidate clean-state for re-created subpatches
             * since we do not know whether the re-created subpatch
             * is clean or unclean (it's undo-queue got lost when
             * it was deleted), we assume the worst */
        if (!canvas_isabstraction(x))
            udo->u_cleanstate = (void*)1;

        a->prev = NULL;
        a->name = "no";
        canvas_show_undomenu(x, "no", "no");
    }
    else
    {
        DEBUG_UNDO(post("%s: re-init %p", __FUNCTION__, udo->u_last->next));
        if (udo->u_last->next)
        {
            //we need to rebranch first then add the new action
            canvas_undo_rebranch(x);
        }
        udo->u_last->next = a;
        a->prev = udo->u_last;
        udo->u_last = a;
    }
    return(a);
}